

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<Vector2f,_std::allocator<Vector2f>_> *
poly_mul<Vector2f>(vector<Vector2f,_std::allocator<Vector2f>_> *a,Vector2f *b)

{
  bool bVar1;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_RDX;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_RDI;
  Vector2f *x;
  iterator __end0;
  iterator __begin0;
  vector<Vector2f,_std::allocator<Vector2f>_> *__range1;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_ffffffffffffff98;
  vector<Vector2f,_std::allocator<Vector2f>_> *v0;
  __normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_> local_28 [5];
  
  v0 = in_RDI;
  local_28[0]._M_current =
       (Vector2f *)
       std::vector<Vector2f,_std::allocator<Vector2f>_>::begin(in_stack_ffffffffffffff98);
  std::vector<Vector2f,_std::allocator<Vector2f>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>
                        *)in_RDX,
                       (__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>::
    operator*(local_28);
    operator*((Vector2f *)v0,(Vector2f *)in_RDI);
    Vector2f::operator=((Vector2f *)in_RDX,(Vector2f *)in_stack_ffffffffffffff98);
    __gnu_cxx::__normal_iterator<Vector2f_*,_std::vector<Vector2f,_std::allocator<Vector2f>_>_>::
    operator++(local_28);
  }
  std::vector<Vector2f,_std::allocator<Vector2f>_>::vector(in_RDX,in_stack_ffffffffffffff98);
  return v0;
}

Assistant:

std::vector<T> poly_mul(std::vector<T> a, Vector2f b) {
	for (auto& x : a) x = x * b;
	return a;
}